

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::Impl::updateFileInfos(Impl *this)

{
  pointer pFVar1;
  undefined8 in_RAX;
  long lVar2;
  mapped_type *this_00;
  int iVar3;
  reference rVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::
  _Rb_tree<int,_std::pair<const_int,_GGSock::FileServer::FileInfo>,_std::_Select1st<std::pair<const_int,_GGSock::FileServer::FileInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  ::clear(&(this->fileInfos)._M_t);
  iVar3 = 0;
  while (uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38),
        iVar3 < (int)(((long)(this->files).
                             super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->files).
                            super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x68)) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->fileUsed,(long)iVar3);
    if ((*rVar4._M_p & rVar4._M_mask) != 0) {
      lVar2 = (long)uStack_38._4_4_;
      pFVar1 = (this->files).
               super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = std::
                map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
                ::operator[](&this->fileInfos,(key_type_conflict *)((long)&uStack_38 + 4));
      FileInfo::operator=(this_00,&pFVar1[lVar2].info);
    }
    iVar3 = uStack_38._4_4_ + 1;
  }
  return true;
}

Assistant:

bool updateFileInfos() {
        fileInfos.clear();

        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }
            const auto & file = files[i];
            fileInfos[i] = file.info;
        }

        return true;
    }